

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

lys_module * lys_parse_path(ly_ctx *ctx,char *path,LYS_INFORMAT format)

{
  int iVar1;
  lys_module *plVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  size_t __n;
  char *pcVar6;
  int *piVar7;
  char *pcVar8;
  char local_1058 [8];
  char rpath [4096];
  
  if (ctx == (ly_ctx *)0x0 || path == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_parse_path");
    return (lys_module *)0x0;
  }
  iVar1 = open(path,0);
  if (iVar1 == -1) {
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    ly_log(ctx,LY_LLERR,LY_ESYS,"Opening file \"%s\" failed (%s).",path,pcVar8);
    return (lys_module *)0x0;
  }
  plVar2 = lys_parse_fd(ctx,iVar1,format);
  close(iVar1);
  if (plVar2 == (lys_module *)0x0) {
    return (lys_module *)0x0;
  }
  pcVar3 = strrchr(path,0x2f);
  pcVar8 = pcVar3 + 1;
  if (pcVar3 == (char *)0x0) {
    pcVar8 = path;
  }
  pcVar4 = strchr(pcVar8,0x40);
  pcVar5 = strrchr(pcVar8,0x2e);
  pcVar3 = plVar2->name;
  __n = strlen(pcVar3);
  iVar1 = strncmp(pcVar8,pcVar3,__n);
  if (iVar1 == 0) {
    pcVar6 = pcVar4;
    if (pcVar4 == (char *)0x0) {
      pcVar6 = pcVar5;
    }
    if (pcVar8 + __n != pcVar6) goto LAB_00157fb2;
  }
  else {
LAB_00157fb2:
    ly_log(ctx,LY_LLWRN,LY_SUCCESS,"File name \"%s\" does not match module name \"%s\".",pcVar8,
           pcVar3);
  }
  if (pcVar4 != (char *)0x0) {
    if ((plVar2->rev_size == '\0') || ((long)pcVar5 - (long)(pcVar4 + 1) != 10)) {
      if (plVar2->rev_size == '\0') {
        pcVar3 = "none";
      }
      else {
        pcVar3 = plVar2->rev->date;
      }
    }
    else {
      pcVar3 = plVar2->rev->date;
      iVar1 = strncmp(pcVar3,pcVar4 + 1,10);
      if (iVar1 == 0) goto LAB_00158098;
    }
    ly_log(ctx,LY_LLWRN,LY_SUCCESS,"File name \"%s\" does not match module revision \"%s\".",pcVar8,
           pcVar3);
  }
LAB_00158098:
  if (plVar2->filepath == (char *)0x0) {
    pcVar3 = realpath(path,local_1058);
    pcVar8 = local_1058;
    if (pcVar3 == (char *)0x0) {
      pcVar8 = path;
    }
    pcVar8 = lydict_insert(ctx,pcVar8,0);
    plVar2->filepath = pcVar8;
  }
  return plVar2;
}

Assistant:

lys_module *
lys_parse_path(struct ly_ctx *ctx, const char *path, LYS_INFORMAT format)
{
    int fd;
    const struct lys_module *ret;
    const char *rev, *dot, *filename;
    size_t len;

    if (!ctx || !path) {
        LOGARG;
        return NULL;
    }

    fd = open(path, O_RDONLY);
    if (fd == -1) {
        LOGERR(ctx, LY_ESYS, "Opening file \"%s\" failed (%s).", path, strerror(errno));
        return NULL;
    }

    ret = lys_parse_fd(ctx, fd, format);
    close(fd);

    if (!ret) {
        /* error */
        return NULL;
    }

    /* check that name and revision match filename */
    filename = strrchr(path, '/');
    if (!filename) {
        filename = path;
    } else {
        filename++;
    }
    rev = strchr(filename, '@');
    dot = strrchr(filename, '.');

    /* name */
    len = strlen(ret->name);
    if (strncmp(filename, ret->name, len) ||
            ((rev && rev != &filename[len]) || (!rev && dot != &filename[len]))) {
        LOGWRN(ctx, "File name \"%s\" does not match module name \"%s\".", filename, ret->name);
    }
    if (rev) {
        len = dot - ++rev;
        if (!ret->rev_size || len != 10 || strncmp(ret->rev[0].date, rev, len)) {
            LOGWRN(ctx, "File name \"%s\" does not match module revision \"%s\".", filename,
                   ret->rev_size ? ret->rev[0].date : "none");
        }
    }

    if (!ret->filepath) {
        /* store URI */
        char rpath[PATH_MAX];
        if (realpath(path, rpath) != NULL) {
            ((struct lys_module *)ret)->filepath = lydict_insert(ctx, rpath, 0);
        } else {
            ((struct lys_module *)ret)->filepath = lydict_insert(ctx, path, 0);
        }
    }

    return ret;
}